

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::passColName(Highs *this,HighsInt col,string *name)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)col;
  uVar1 = (this->model_).lp_.num_col_;
  if (col < 0 || (int)uVar1 <= col) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Index %d for column name %s is outside the range [0, num_col = %d)\n",uVar2,
                 (name->_M_dataplus)._M_p);
  }
  else {
    if (0 < (int)name->_M_string_length) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&(this->model_).lp_.col_names_,(ulong)uVar1);
      HighsNameHash::update
                (&(this->model_).lp_.col_hash_,col,
                 (this->model_).lp_.col_names_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar2,name);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((this->model_).lp_.col_names_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar2));
      return kOk;
    }
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Cannot define empty column names\n");
  }
  return kError;
}

Assistant:

HighsStatus Highs::passColName(const HighsInt col, const std::string& name) {
  const HighsInt num_col = this->model_.lp_.num_col_;
  if (col < 0 || col >= num_col) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Index %d for column name %s is outside the range [0, num_col = %d)\n",
        int(col), name.c_str(), int(num_col));
    return HighsStatus::kError;
  }
  if (int(name.length()) <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot define empty column names\n");
    return HighsStatus::kError;
  }
  this->model_.lp_.col_names_.resize(num_col);
  this->model_.lp_.col_hash_.update(col, this->model_.lp_.col_names_[col],
                                    name);
  this->model_.lp_.col_names_[col] = name;
  return HighsStatus::kOk;
}